

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O0

void __thiscall fmp4_stream::box::parse(box *this,char *ptr)

{
  uint32_t uVar1;
  char *__end;
  uint64_t uVar2;
  char *__beg;
  allocator<char> local_39;
  string local_38 [32];
  char *local_18;
  char *ptr_local;
  box *this_local;
  
  local_18 = ptr;
  ptr_local = (char *)this;
  uVar1 = anon_unknown.dwarf_2d683::fmp4_read_uint32(ptr);
  this->size_ = uVar1;
  __beg = local_18 + 4;
  __end = local_18 + 8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<char_const*,void>(local_38,__beg,__end,&local_39);
  std::__cxx11::string::operator=((string *)&this->box_type_,local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  if (this->size_ == 1) {
    uVar2 = anon_unknown.dwarf_2d683::fmp4_read_uint64(local_18 + 8);
    this->large_size_ = uVar2;
  }
  return;
}

Assistant:

void box::parse(char const* ptr)
	{
		size_ = fmp4_read_uint32(ptr);
		box_type_ = std::string(ptr + 4, ptr + 8);
		if (size_ == 1) {
			large_size_ = fmp4_read_uint64(ptr + 8);
		}
	}